

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Serializer.hpp
# Opt level: O0

void mserialize::detail::
     BuiltinSerializer<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>
     ::serialize_elems<binlog::detail::RecoverableVectorOutputStream>
               (undefined8 param_1,uint param_2,RecoverableVectorOutputStream *param_3,
               size_t param_4)

{
  char *pcVar1;
  size_t serialized_size;
  char *data;
  int in_stack_ffffffffffffffcc;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffffd0;
  
  if (param_2 != 0) {
    pcVar1 = sequence_data<std::__cxx11::string_const>
                       (in_stack_ffffffffffffffd0,in_stack_ffffffffffffffcc);
    binlog::detail::RecoverableVectorOutputStream::write
              (param_3,(int)pcVar1,(void *)(ulong)param_2,param_4);
  }
  return;
}

Assistant:

static void serialize_elems(
    std::true_type /* batch copy */,
    const Sequence& s, std::uint32_t size, OutputStream& ostream
  )
  {
    // Avoid passing nullptr `data` to write, that ends up calling memcpy
    // (e.g: if OutputStream is QueueWriter) as it is undefined behavior
    // C11 7.24.1 String function conventions p2
    if (size)
    {
      const char* data = reinterpret_cast<const char*>(sequence_data(s));
      const size_t serialized_size = sizeof(sequence_data_t<const Sequence>) * size;
      ostream.write(data, std::streamsize(serialized_size));
    }
  }